

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

Abc_Ntk_t *
Abc_NtkMiterBm(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Vec_Ptr_t *iCurrMatch,Vec_Ptr_t *oCurrMatch)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  void *pvVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t *p;
  Abc_Obj_t *pNode_2;
  int i_3;
  Abc_Obj_t *pMiter;
  Vec_Ptr_t *vPairs;
  int i_2;
  Abc_Obj_t *pNode_1;
  int i_1;
  Abc_Obj_t *pNode;
  int i;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkMiter;
  char Buffer [1000];
  Vec_Ptr_t *oCurrMatch_local;
  Vec_Ptr_t *iCurrMatch_local;
  Abc_Ntk_t *pNtk2_local;
  Abc_Ntk_t *pNtk1_local;
  
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  sprintf((char *)&pNtkMiter,"%s_%s_miter",pNtk1->pName,pNtk2->pName);
  pcVar3 = Extra_UtilStrsav((char *)&pNtkMiter);
  pNtk->pName = pcVar3;
  pAVar4 = Abc_AigConst1(pNtk);
  pAVar5 = Abc_AigConst1(pNtk1);
  (pAVar5->field_6).pCopy = pAVar4;
  pAVar4 = Abc_AigConst1(pNtk);
  pAVar5 = Abc_AigConst1(pNtk2);
  (pAVar5->field_6).pCopy = pAVar4;
  if (iCurrMatch == (Vec_Ptr_t *)0x0) {
    for (pNode._4_4_ = 0; iVar2 = Abc_NtkCiNum(pNtk1), pNode._4_4_ < iVar2;
        pNode._4_4_ = pNode._4_4_ + 1) {
      pAVar4 = Abc_NtkCi(pNtk1,pNode._4_4_);
      pAVar5 = Abc_NtkCreatePi(pNtk);
      (pAVar4->field_6).pCopy = pAVar5;
      pAVar4 = Abc_NtkCi(pNtk2,pNode._4_4_);
      (pAVar4->field_6).pCopy = pAVar5;
      pcVar3 = Abc_ObjName(pAVar4);
      Abc_ObjAssignName(pAVar5,pcVar3,(char *)0x0);
    }
  }
  else {
    for (pNode._4_4_ = 0; iVar2 = Vec_PtrSize(iCurrMatch), pNode._4_4_ < iVar2;
        pNode._4_4_ = pNode._4_4_ + 2) {
      pAVar4 = Abc_NtkCreatePi(pNtk);
      pvVar6 = Vec_PtrEntry(iCurrMatch,pNode._4_4_);
      *(Abc_Obj_t **)((long)pvVar6 + 0x40) = pAVar4;
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch,pNode._4_4_ + 1);
      (pAVar5->field_6).pCopy = pAVar4;
      pcVar3 = Abc_ObjName(pAVar5);
      Abc_ObjAssignName(pAVar4,pcVar3,(char *)0x0);
    }
  }
  pAVar4 = Abc_NtkCreatePo(pNtk);
  Abc_ObjAssignName(pAVar4,"miter",(char *)0x0);
  iVar2 = Abc_NtkIsDfsOrdered(pNtk1);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcBm.c"
                  ,0x2f3,
                  "Abc_Ntk_t *Abc_NtkMiterBm(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  for (pNode_1._4_4_ = 0; iVar2 = Vec_PtrSize(pNtk1->vObjs), pNode_1._4_4_ < iVar2;
      pNode_1._4_4_ = pNode_1._4_4_ + 1) {
    pAVar4 = Abc_NtkObj(pNtk1,pNode_1._4_4_);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar4), iVar2 != 0)) {
      pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar5 = Abc_ObjChild0Copy(pAVar4);
      pAVar7 = Abc_ObjChild1Copy(pAVar4);
      pAVar5 = Abc_AigAnd(pAVar1,pAVar5,pAVar7);
      (pAVar4->field_6).pCopy = pAVar5;
    }
  }
  iVar2 = Abc_NtkIsDfsOrdered(pNtk2);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcBm.c"
                  ,0x2fc,
                  "Abc_Ntk_t *Abc_NtkMiterBm(Abc_Ntk_t *, Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  for (vPairs._4_4_ = 0; iVar2 = Vec_PtrSize(pNtk2->vObjs), vPairs._4_4_ < iVar2;
      vPairs._4_4_ = vPairs._4_4_ + 1) {
    pAVar4 = Abc_NtkObj(pNtk2,vPairs._4_4_);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar4), iVar2 != 0)) {
      pAVar1 = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar5 = Abc_ObjChild0Copy(pAVar4);
      pAVar7 = Abc_ObjChild1Copy(pAVar4);
      pAVar5 = Abc_AigAnd(pAVar1,pAVar5,pAVar7);
      (pAVar4->field_6).pCopy = pAVar5;
    }
  }
  p = Vec_PtrAlloc(100);
  if (oCurrMatch == (Vec_Ptr_t *)0x0) {
    for (pNode_2._4_4_ = 0; iVar2 = Abc_NtkCoNum(pNtk1), pNode_2._4_4_ < iVar2;
        pNode_2._4_4_ = pNode_2._4_4_ + 1) {
      pAVar4 = Abc_NtkCo(pNtk1,pNode_2._4_4_);
      pAVar4 = Abc_ObjChild0Copy(pAVar4);
      Vec_PtrPush(p,pAVar4);
      pAVar4 = Abc_NtkCo(pNtk2,pNode_2._4_4_);
      pAVar4 = Abc_ObjChild0Copy(pAVar4);
      Vec_PtrPush(p,pAVar4);
    }
  }
  else {
    for (pNode_2._4_4_ = 0; iVar2 = Vec_PtrSize(oCurrMatch), pNode_2._4_4_ < iVar2;
        pNode_2._4_4_ = pNode_2._4_4_ + 2) {
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(oCurrMatch,pNode_2._4_4_);
      pAVar4 = Abc_ObjChild0Copy(pAVar4);
      Vec_PtrPush(p,pAVar4);
      pAVar4 = (Abc_Obj_t *)Vec_PtrEntry(oCurrMatch,pNode_2._4_4_ + 1);
      pAVar4 = Abc_ObjChild0Copy(pAVar4);
      Vec_PtrPush(p,pAVar4);
    }
  }
  pAVar4 = Abc_AigMiter((Abc_Aig_t *)pNtk->pManFunc,p,0);
  pAVar5 = Abc_NtkPo(pNtk,0);
  Abc_ObjAddFanin(pAVar5,pAVar4);
  Vec_PtrFree(p);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterBm( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Vec_Ptr_t * iCurrMatch, Vec_Ptr_t * oCurrMatch )
{
	char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;

	pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    sprintf( Buffer, "%s_%s_miter", pNtk1->pName, pNtk2->pName );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

	//Abc_NtkMiterPrepare( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize );
	{
		Abc_Obj_t * pObj, * pObjNew;
		int i;

		Abc_AigConst1(pNtk1)->pCopy = Abc_AigConst1(pNtkMiter);
		Abc_AigConst1(pNtk2)->pCopy = Abc_AigConst1(pNtkMiter);

		// create new PIs and remember them in the old PIs
		if(iCurrMatch == NULL)
		{
			Abc_NtkForEachCi( pNtk1, pObj, i )
			{
				pObjNew = Abc_NtkCreatePi( pNtkMiter );
				// remember this PI in the old PIs
				pObj->pCopy = pObjNew;
				pObj = Abc_NtkCi(pNtk2, i);  
				pObj->pCopy = pObjNew;
				// add name
				Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
			}
		}
		else
		{
			for(i = 0; i < Vec_PtrSize( iCurrMatch ); i += 2)
			{
				pObjNew = Abc_NtkCreatePi( pNtkMiter );
				pObj = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch, i);
				pObj->pCopy = pObjNew;
				pObj = (Abc_Obj_t *)Vec_PtrEntry(iCurrMatch, i+1);
				pObj->pCopy = pObjNew;
				// add name
				Abc_ObjAssignName( pObjNew, Abc_ObjName(pObj), NULL );
			}
		}

        // create the only PO
        pObjNew = Abc_NtkCreatePo( pNtkMiter );
        // add the PO name
        Abc_ObjAssignName( pObjNew, "miter", NULL );
	}

	// Abc_NtkMiterAddOne( pNtk1, pNtkMiter );
	{
		Abc_Obj_t * pNode;
		int i;
		assert( Abc_NtkIsDfsOrdered(pNtk1) );
		Abc_AigForEachAnd( pNtk1, pNode, i )
			pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
	}

	// Abc_NtkMiterAddOne( pNtk2, pNtkMiter );
	{
		Abc_Obj_t * pNode;
		int i;
		assert( Abc_NtkIsDfsOrdered(pNtk2) );
		Abc_AigForEachAnd( pNtk2, pNode, i )
			pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
	}
	
	// Abc_NtkMiterFinalize( pNtk1, pNtk2, pNtkMiter, fComb, nPartSize );	
	{
		Vec_Ptr_t * vPairs;
		Abc_Obj_t * pMiter;
		int i;

		vPairs = Vec_PtrAlloc( 100 );
	    
		// collect the CO nodes for the miter
		if(oCurrMatch != NULL)
		{
			for(i = 0; i < Vec_PtrSize( oCurrMatch ); i += 2)
			{
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oCurrMatch, i)) );
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy((Abc_Obj_t *)Vec_PtrEntry(oCurrMatch, i+1)) );
			}
		}
		else
		{
			Abc_Obj_t * pNode;

			Abc_NtkForEachCo( pNtk1, pNode, i )
			{
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
				pNode = Abc_NtkCo( pNtk2, i );
				Vec_PtrPush( vPairs, Abc_ObjChild0Copy(pNode) );
			}
		}
		
	 pMiter = Abc_AigMiter( (Abc_Aig_t *)pNtkMiter->pManFunc, vPairs, 0 );
	 Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );
	 Vec_PtrFree(vPairs);
	}

	//Abc_AigCleanup(pNtkMiter->pManFunc);
	
	return pNtkMiter;
}